

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopReportController.cpp
# Opt level: O0

QuerySpec * __thiscall
anon_unknown.dwarf_3fca37::LoopReportController::summary_query
          (QuerySpec *__return_storage_ptr__,LoopReportController *this)

{
  char *str;
  CalQLParser local_80 [3];
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string query;
  char *query_str;
  LoopReportController *this_local;
  
  query.field_2._8_8_ = anon_var_dwarf_3fce14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,
             " select loop as Loop,max(sum#loop.iterations) as \"Iterations\",max(scale#time.duration.ns) as \"Time (s)\",min(min#iter_per_sec) as \"Iter/s (min)\",max(max#iter_per_sec) as \"Iter/s (max)\",ratio(sum#loop.iterations,scale#time.duration.ns) as \"Iter/s (avg)\" aggregate max(count) group by loop format table"
             ,&local_61);
  cali::ConfigManager::Options::build_query((string *)local_40,&this->m_opts,"cross",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  str = (char *)std::__cxx11::string::c_str();
  cali::CalQLParser::CalQLParser(local_80,str);
  cali::CalQLParser::spec(__return_storage_ptr__,local_80);
  cali::CalQLParser::~CalQLParser(local_80);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

QuerySpec summary_query()
    {
        const char* query_str =
            " select loop as Loop"
            ",max(sum#loop.iterations) as \"Iterations\""
            ",max(scale#time.duration.ns) as \"Time (s)\""
            ",min(min#iter_per_sec) as \"Iter/s (min)\""
            ",max(max#iter_per_sec) as \"Iter/s (max)\""
            ",ratio(sum#loop.iterations,scale#time.duration.ns) as \"Iter/s (avg)\""
            " aggregate max(count) group by loop format table";

        std::string query = m_opts.build_query("cross", query_str);

        return CalQLParser(query.c_str()).spec();
    }